

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

Gia_Man_t *
Gia_GenQbfMiter(Gia_Man_t *p,int nFrames,int nLutNum,int nLutSize,char *pStr,int fUseOut,
               int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vFlops_00;
  Vec_Int_t *vParLits_00;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_ac;
  int iOut;
  Gia_Obj_t *pObjPoLast;
  Vec_Int_t *vFlops;
  Vec_Int_t *vParLits;
  Vec_Int_t *vLits1;
  Vec_Int_t *vLits0;
  int local_58;
  int nPars;
  int iLut1;
  int iLut0;
  int iMiter;
  int i;
  Gia_Man_t *pNew;
  Gia_Man_t *pTemp;
  Gia_Obj_t *pObj;
  int fUseOut_local;
  char *pStr_local;
  int nLutSize_local;
  int nLutNum_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  iVar1 = nLutNum * (1 << ((byte)nLutSize & 0x1f));
  iVar2 = Gia_ManRegNum(p);
  vFlops_00 = Gia_GenCollectFlopIndexes(pStr,nLutNum,nLutSize,iVar2);
  vParLits_00 = Vec_IntAlloc(iVar1);
  for (iLut0 = 0; iLut0 < iVar1; iLut0 = iLut0 + 1) {
    if (iLut0 == 0) {
      local_ac = 1;
    }
    else {
      local_ac = Abc_Var2Lit(iLut0 + 1,0);
    }
    Vec_IntPush(vParLits_00,local_ac);
  }
  iVar2 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar2);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManHashAlloc(p_00);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  for (iLut0 = 0; iLut0 < iVar1; iLut0 = iLut0 + 1) {
    Gia_ManAppendCi(p_00);
  }
  iLut0 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (iLut0 < iVar1) {
      pTemp = (Gia_Man_t *)Gia_ManCi(p,iLut0);
      bVar6 = pTemp != (Gia_Man_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ManAppendCi(p_00);
    *(int *)&pTemp->pSpec = iVar1;
    iLut0 = iLut0 + 1;
  }
  iLut0 = 0;
  while( true ) {
    bVar6 = false;
    if (iLut0 < p->nObjs) {
      pTemp = (Gia_Man_t *)Gia_ManObj(p,iLut0);
      bVar6 = pTemp != (Gia_Man_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pTemp);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pTemp);
      iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)pTemp);
      iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      *(int *)&pTemp->pSpec = iVar1;
    }
    iLut0 = iLut0 + 1;
  }
  iLut0 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (iLut0 < iVar1) {
      pTemp = (Gia_Man_t *)Gia_ManCo(p,iLut0);
      bVar6 = pTemp != (Gia_Man_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pTemp);
    *(int *)&pTemp->pSpec = iVar1;
    iLut0 = iLut0 + 1;
  }
  p_01 = Gia_GenCreateMuxes(p,p_00,vFlops_00,nLutNum,nLutSize,vParLits_00,0);
  p_02 = Gia_GenCreateMuxes(p,p_00,vFlops_00,nLutNum,nLutSize,vParLits_00,1);
  iVar1 = Vec_IntEntry(p_01,0);
  local_58 = Vec_IntEntry(p_02,0);
  if (fUseOut != 0) {
    iVar2 = Gia_ManPoNum(p);
    pGVar4 = Gia_ManPo(p,iVar2 + -1);
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    iVar2 = Abc_LitNotCond(iVar2,0);
    iVar2 = Abc_LitNot(iVar2);
    local_58 = Gia_ManHashAnd(p_00,local_58,iVar2);
  }
  iVar2 = Abc_LitNot(local_58);
  iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
  iVar1 = Abc_LitNot(iVar1);
  iVar2 = Abc_Var2Lit(1,0);
  iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
  Gia_ManAppendCo(p_00,iVar1);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(vFlops_00);
  Vec_IntFree(vParLits_00);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * p, int nFrames, int nLutNum, int nLutSize, char * pStr, int fUseOut, int fVerbose )
{
    Gia_Obj_t * pObj; 
    Gia_Man_t * pTemp, * pNew;
    int i, iMiter, iLut0, iLut1, nPars = nLutNum * (1 << nLutSize);
    Vec_Int_t * vLits0, * vLits1, * vParLits;
    Vec_Int_t * vFlops = Gia_GenCollectFlopIndexes( pStr, nLutNum, nLutSize, Gia_ManRegNum(p) );
    // collect parameter literals (data vars)
    vParLits = Vec_IntAlloc( nPars );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vParLits, i ? Abc_Var2Lit(i+1, 0) : 1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPars; i++ )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    vLits0 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 0 );
    vLits1 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 1 );
    // create miter output
    //iMiter = Gia_ManHashAnd( pNew, Vec_IntEntry(vLits0, 0), Abc_LitNot(Vec_IntEntry(vLits1, 0)) );
    ///////////////////////////////////////////////////////////////////////////
    iLut0 = Vec_IntEntry(vLits0, 0);
    iLut1 = Vec_IntEntry(vLits1, 0);
    if ( fUseOut )
    {
        Gia_Obj_t * pObjPoLast = Gia_ManPo( p, Gia_ManPoNum(p)-1 );
        int iOut = Abc_LitNotCond( Gia_ObjFanin0Copy(pObjPoLast), 0 );
        iLut1 = Gia_ManHashAnd( pNew, iLut1, Abc_LitNot(iOut) );
    }
    iMiter = Gia_ManHashAnd( pNew, iLut0, Abc_LitNot(iLut1) );
    ///////////////////////////////////////////////////////////////////////////
    iMiter = Gia_ManHashAnd( pNew, Abc_LitNot(iMiter), Abc_Var2Lit(1, 0) );
    Gia_ManAppendCo( pNew, iMiter );
    // cleanup
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vFlops );
    Vec_IntFree( vParLits );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}